

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

Type __thiscall capnp::Schema::interpretType(Schema *this,Reader proto,uint location)

{
  Reader proto_00;
  uint uVar1;
  short sVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 uVar5;
  anon_union_8_2_eba6ea51_for_Type_5 aVar6;
  byte bVar7;
  ushort uVar8;
  uint index;
  uint64_t uVar9;
  anon_union_2_2_d12d5221_for_Type_3 aVar10;
  PointerReader *pPVar11;
  ulong uVar12;
  Type TVar13;
  Type TVar14;
  PointerReader local_68;
  StructReader local_48;
  
  if (proto._reader.dataSize < 0x10) {
    uVar8 = 0;
  }
  else {
    uVar8 = *proto._reader.data;
  }
  if (uVar8 < 0xe) {
    if (proto._reader.dataSize < 0x10) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ulong)*proto._reader.data;
    }
LAB_001a9a7d:
    uVar1 = 0;
LAB_001a9a81:
    uVar3 = uVar1;
    aVar10.paramIndex = 0;
LAB_001a9a83:
    bVar7 = 0;
    uVar12 = 0;
    TVar14.field_4.schema = (RawBrandedSchema *)0x0;
    TVar14.baseType = (short)uVar4;
    TVar14.listDepth = (char)(uVar4 >> 0x10);
    TVar14.isImplicitParam = (bool)(char)(uVar4 >> 0x18);
    TVar14.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)(uVar4 >> 0x20);
    TVar14._6_2_ = (short)(uVar4 >> 0x30);
  }
  else {
    switch(uVar8) {
    case 0xe:
      if (proto._reader.pointerCount == 0) {
        proto._reader.nestingLimit = 0x7fffffff;
        proto._reader.capTable = (CapTableReader *)0x0;
        proto._reader.pointers = (WirePointer *)0x0;
        proto._reader.segment = (SegmentReader *)0x0;
      }
      local_68.segment = proto._reader.segment;
      local_68.capTable = proto._reader.capTable;
      local_68.pointer = proto._reader.pointers;
      local_68.nestingLimit = proto._reader.nestingLimit;
      capnp::_::PointerReader::getStruct(&local_48,&local_68,(word *)0x0);
      proto_00._reader.capTable = local_48.capTable;
      proto_00._reader.segment = local_48.segment;
      proto_00._reader.data = local_48.data;
      proto_00._reader.pointers = local_48.pointers;
      proto_00._reader.dataSize = local_48.dataSize;
      proto_00._reader.pointerCount = local_48.pointerCount;
      proto_00._reader._38_2_ = local_48._38_2_;
      proto_00._reader.nestingLimit = local_48.nestingLimit;
      proto_00._reader._44_4_ = local_48._44_4_;
      TVar14 = interpretType(this,proto_00,location);
      uVar12 = TVar14._0_8_;
      aVar10 = TVar14.field_3;
      bVar7 = TVar14.listDepth + 1;
LAB_001a9caf:
      uVar12 = uVar12 & 0xffff000000000000;
      uVar3 = TVar14._0_4_;
      goto LAB_001a9a88;
    case 0xf:
      if (proto._reader.dataSize < 0x80) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(uint64_t *)((long)proto._reader.data + 8);
      }
      local_68.segment = (SegmentReader *)getDependency(this,uVar9,location);
      pPVar11 = &local_68;
      aVar6 = (anon_union_8_2_eba6ea51_for_Type_5)asEnum((Schema *)pPVar11);
      aVar10.paramIndex = (uint16_t)pPVar11;
      uVar5 = 0xf;
      break;
    case 0x10:
      if (proto._reader.dataSize < 0x80) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(uint64_t *)((long)proto._reader.data + 8);
      }
      local_68.segment = (SegmentReader *)getDependency(this,uVar9,location);
      pPVar11 = &local_68;
      aVar6 = (anon_union_8_2_eba6ea51_for_Type_5)asStruct((Schema *)pPVar11);
      aVar10.paramIndex = (uint16_t)pPVar11;
      uVar5 = 0x10;
      break;
    case 0x11:
      if (proto._reader.dataSize < 0x80) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(uint64_t *)((long)proto._reader.data + 8);
      }
      local_68.segment = (SegmentReader *)getDependency(this,uVar9,location);
      pPVar11 = &local_68;
      aVar6 = (anon_union_8_2_eba6ea51_for_Type_5)asInterface((Schema *)pPVar11);
      aVar10.paramIndex = (uint16_t)pPVar11;
      uVar5 = 0x11;
      break;
    case 0x12:
      if (proto._reader.dataSize < 0x50) {
        sVar2 = 0;
      }
      else {
        sVar2 = *(short *)((long)proto._reader.data + 8);
      }
      if (sVar2 == 2) {
        uVar3 = 0x1000000;
        uVar4 = 0x12;
        uVar1 = 0x1000000;
        if (proto._reader.dataSize < 0x60) goto LAB_001a9a81;
        aVar10 = (anon_union_2_2_d12d5221_for_Type_3)
                 ((anon_union_2_2_d12d5221_for_Type_3 *)((long)proto._reader.data + 10))->paramIndex
        ;
      }
      else {
        if (sVar2 == 1) {
          index = 0;
          if (proto._reader.dataSize < 0xc0) {
            uVar9 = 0;
          }
          else {
            uVar9 = *(uint64_t *)((long)proto._reader.data + 0x10);
          }
          if (0x5f < proto._reader.dataSize) {
            index = (uint)*(ushort *)((long)proto._reader.data + 10);
          }
          TVar14 = getBrandBinding(this,uVar9,index);
          uVar12 = TVar14._0_8_;
          bVar7 = TVar14.listDepth;
          aVar10 = TVar14.field_3;
          goto LAB_001a9caf;
        }
        if (sVar2 != 0) goto switchD_001a9ad3_default;
        uVar4 = 0x12;
        if (proto._reader.dataSize < 0x60) goto LAB_001a9a7d;
        aVar10 = (anon_union_2_2_d12d5221_for_Type_3)
                 ((anon_union_2_2_d12d5221_for_Type_3 *)((long)proto._reader.data + 10))->paramIndex
        ;
        uVar3 = 0;
      }
      goto LAB_001a9a83;
    default:
switchD_001a9ad3_default:
      kj::_::unreachable();
    }
    TVar14.field_4.schema = aVar6.schema;
    TVar14.baseType = (short)uVar5;
    TVar14.listDepth = (char)((ulong)uVar5 >> 0x10);
    TVar14.isImplicitParam = (bool)(char)((ulong)uVar5 >> 0x18);
    TVar14.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)((ulong)uVar5 >> 0x20);
    TVar14._6_2_ = (short)((ulong)uVar5 >> 0x30);
    bVar7 = 0;
    uVar3 = 0;
    uVar12 = 0;
  }
LAB_001a9a88:
  TVar13.field_4 = TVar14.field_4;
  TVar13._0_8_ = TVar14._0_8_ & 0xffff | (ulong)bVar7 << 0x10 |
                 uVar3 & 0xff000000 | uVar12 | (ulong)aVar10.paramIndex << 0x20;
  return TVar13;
}

Assistant:

Type Schema::interpretType(schema::Type::Reader proto, uint location) const {
  switch (proto.which()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      return proto.which();

    case schema::Type::STRUCT: {
      auto structType = proto.getStruct();
      return getDependency(structType.getTypeId(), location).asStruct();
    }

    case schema::Type::ENUM: {
      auto enumType = proto.getEnum();
      return getDependency(enumType.getTypeId(), location).asEnum();
    }

    case schema::Type::INTERFACE: {
      auto interfaceType = proto.getInterface();
      return getDependency(interfaceType.getTypeId(), location).asInterface();
    }

    case schema::Type::LIST:
      return ListSchema::of(interpretType(proto.getList().getElementType(), location));

    case schema::Type::ANY_POINTER: {
      auto anyPointer = proto.getAnyPointer();
      switch (anyPointer.which()) {
        case schema::Type::AnyPointer::UNCONSTRAINED:
          return anyPointer.getUnconstrained().which();
        case schema::Type::AnyPointer::PARAMETER: {
          auto param = anyPointer.getParameter();
          return getBrandBinding(param.getScopeId(), param.getParameterIndex());
        }
        case schema::Type::AnyPointer::IMPLICIT_METHOD_PARAMETER:
          return Type(Type::ImplicitParameter {
              anyPointer.getImplicitMethodParameter().getParameterIndex() });
      }

      KJ_UNREACHABLE;
    }
  }

  KJ_UNREACHABLE;
}